

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::trun::print(trun *this)

{
  _Setw _Var1;
  ostream *poVar2;
  void *pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  uint local_34;
  uint i;
  trun *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"==================trun=================");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," magic conf                 ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,(this->super_full_box).magic_conf_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," sample count:      ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,*(uint *)&(this->super_full_box).field_0x6c);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  if ((this->data_offset_present_ & 1U) != 0) {
    _Var1 = std::setw(0x21);
    poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
    poVar2 = std::operator<<(poVar2," data_offset:        ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,this->data_offset_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((this->first_sample_flags_present_ & 1U) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout," first sample flags:        ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,this->first_sample_flags_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," first sample flags present:  ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,(bool)(this->first_sample_flags_present_ & 1));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," sample duration present: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,(bool)(this->sample_duration_present_ & 1));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," sample_size_present: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,(bool)(this->sample_size_present_ & 1));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," sample_flags_present: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,(bool)(this->sample_flags_present_ & 1));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setw(0x21);
  poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2," sample_ct_offsets_present: ");
  pvVar3 = (void *)std::ostream::operator<<
                             (poVar2,(bool)(this->sample_composition_time_offsets_present_ & 1));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  local_34 = 0;
  while( true ) {
    sVar4 = std::
            vector<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
            ::size(&this->m_sentry);
    if (sVar4 <= local_34) break;
    pvVar5 = std::
             vector<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
             ::operator[](&this->m_sentry,(ulong)local_34);
    (**pvVar5->_vptr_sample_entry)();
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void trun::print() const
	{
		std::cout << "==================trun=================" << std::endl;
		std::cout << std::setw(33) << std::left << " magic conf                 " << magic_conf_ << std::endl;
		std::cout << std::setw(33) << std::left << " sample count:      " << sample_count_ << std::endl;
		if (data_offset_present_)
			std::cout << std::setw(33) << std::left << " data_offset:        " << data_offset_ << std::endl;
		if (first_sample_flags_present_)
			std::cout << " first sample flags:        " << first_sample_flags_ << std::endl;

		std::cout << std::setw(33) << std::left << " first sample flags present:  " << first_sample_flags_present_ << std::endl;
		std::cout << std::setw(33) << std::left << " sample duration present: " << sample_duration_present_ << std::endl;
		std::cout << std::setw(33) << std::left << " sample_size_present: " << sample_size_present_ << std::endl;
		std::cout << std::setw(33) << std::left << " sample_flags_present: " << sample_flags_present_ << std::endl;
		std::cout << std::setw(33) << std::left << " sample_ct_offsets_present: " << sample_composition_time_offsets_present_ << std::endl;

		for (unsigned int i = 0; i < m_sentry.size(); i++)
			m_sentry[i].print();
	}